

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRunner.cpp
# Opt level: O0

void __thiscall UnitTest::TestRunner::TestRunner(TestRunner *this,TestReporter *reporter)

{
  TestResults *this_00;
  Timer *this_01;
  TestReporter *reporter_local;
  TestRunner *this_local;
  
  this->m_reporter = reporter;
  this_00 = (TestResults *)operator_new(0x18);
  TestResults::TestResults(this_00,reporter);
  this->m_result = this_00;
  this_01 = (Timer *)operator_new(0x10);
  Timer::Timer(this_01);
  this->m_timer = this_01;
  Timer::Start(this->m_timer);
  return;
}

Assistant:

TestRunner::TestRunner(TestReporter& reporter)
	: m_reporter(&reporter)
	, m_result(new TestResults(&reporter))
	, m_timer(new Timer)
{
	m_timer->Start();
}